

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect.cpp
# Opt level: O2

void alGenEffects(ALsizei n,ALuint *effects)

{
  ALCdevice *device;
  pointer pEVar1;
  ALeffect *pAVar2;
  long lVar3;
  uint uVar4;
  char *pcVar5;
  ulong uVar6;
  ContextRef context;
  vector<ALuint> ids;
  ulong __n;
  
  __n = (ulong)(uint)n;
  GetContextRef();
  if (context.mPtr != (ALCcontext *)0x0) {
    if (n < 0) {
      ALCcontext::setError(context.mPtr,0xa003,"Generating %d effects",__n);
    }
    else if (n != 0) {
      device = ((context.mPtr)->mDevice).mPtr;
      std::mutex::lock(&device->EffectLock);
      lVar3 = 0;
      for (pEVar1 = (device->EffectList).
                    super__Vector_base<EffectSubList,_al::allocator<EffectSubList,_8UL>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pEVar1 != (device->EffectList).
                    super__Vector_base<EffectSubList,_al::allocator<EffectSubList,_8UL>_>._M_impl.
                    super__Vector_impl_data._M_finish; pEVar1 = pEVar1 + 1) {
        uVar6 = pEVar1->FreeMask - (pEVar1->FreeMask >> 1 & 0x5555555555555555);
        uVar6 = (uVar6 >> 2 & 0x3333333333333333) + (uVar6 & 0x3333333333333333);
        lVar3 = lVar3 + (((uVar6 >> 4) + uVar6 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38);
      }
      uVar6 = lVar3 - 0x40;
      do {
        uVar6 = uVar6 + 0x40;
        if (__n <= uVar6) {
          if (n == 1) {
            pAVar2 = anon_unknown.dwarf_22f89::AllocEffect(device);
            *effects = pAVar2->id;
          }
          else {
            ids.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            ids.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            ids.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            std::vector<unsigned_int,_al::allocator<unsigned_int,_4UL>_>::reserve(&ids,__n);
            do {
              pAVar2 = anon_unknown.dwarf_22f89::AllocEffect(device);
              std::vector<unsigned_int,al::allocator<unsigned_int,4ul>>::emplace_back<unsigned_int&>
                        ((vector<unsigned_int,al::allocator<unsigned_int,4ul>> *)&ids,&pAVar2->id);
              uVar4 = (int)__n - 1;
              __n = (ulong)uVar4;
            } while (uVar4 != 0);
            if ((long)ids.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)ids.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>.
                      _M_impl.super__Vector_impl_data._M_start != 0) {
              memmove(effects,ids.
                              super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                      (long)ids.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)ids.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>.
                            _M_impl.super__Vector_impl_data._M_start);
            }
            std::_Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>::~_Vector_base
                      (&ids.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>);
          }
          goto LAB_0011b1a4;
        }
        if (0x1ffffff0 <
            (ulong)((long)(device->EffectList).
                          super__Vector_base<EffectSubList,_al::allocator<EffectSubList,_8UL>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                   (long)(device->EffectList).
                         super__Vector_base<EffectSubList,_al::allocator<EffectSubList,_8UL>_>.
                         _M_impl.super__Vector_impl_data._M_start)) goto LAB_0011b15c;
        std::vector<EffectSubList,_al::allocator<EffectSubList,_8UL>_>::emplace_back<>
                  (&device->EffectList);
        pEVar1 = (device->EffectList).
                 super__Vector_base<EffectSubList,_al::allocator<EffectSubList,_8UL>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        pEVar1[-1].FreeMask = 0xffffffffffffffff;
        pAVar2 = (ALeffect *)al_calloc(8,0x2000);
        pEVar1[-1].Effects = pAVar2;
      } while (pAVar2 != (ALeffect *)0x0);
      std::vector<EffectSubList,_al::allocator<EffectSubList,_8UL>_>::pop_back(&device->EffectList);
LAB_0011b15c:
      pcVar5 = "s";
      if (n == 1) {
        pcVar5 = "";
      }
      ALCcontext::setError(context.mPtr,0xa005,"Failed to allocate %d effect%s",__n,pcVar5);
LAB_0011b1a4:
      pthread_mutex_unlock((pthread_mutex_t *)&device->EffectLock);
    }
  }
  al::intrusive_ptr<ALCcontext>::~intrusive_ptr(&context);
  return;
}

Assistant:

AL_API void AL_APIENTRY alGenEffects(ALsizei n, ALuint *effects)
START_API_FUNC
{
    ContextRef context{GetContextRef()};
    if UNLIKELY(!context) return;

    if UNLIKELY(n < 0)
        context->setError(AL_INVALID_VALUE, "Generating %d effects", n);
    if UNLIKELY(n <= 0) return;

    ALCdevice *device{context->mDevice.get()};
    std::lock_guard<std::mutex> _{device->EffectLock};
    if(!EnsureEffects(device, static_cast<ALuint>(n)))
    {
        context->setError(AL_OUT_OF_MEMORY, "Failed to allocate %d effect%s", n, (n==1)?"":"s");
        return;
    }

    if LIKELY(n == 1)
    {
        /* Special handling for the easy and normal case. */
        ALeffect *effect{AllocEffect(device)};
        effects[0] = effect->id;
    }
    else
    {
        /* Store the allocated buffer IDs in a separate local list, to avoid
         * modifying the user storage in case of failure.
         */
        al::vector<ALuint> ids;
        ids.reserve(static_cast<ALuint>(n));
        do {
            ALeffect *effect{AllocEffect(device)};
            ids.emplace_back(effect->id);
        } while(--n);
        std::copy(ids.cbegin(), ids.cend(), effects);
    }